

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O1

void malloc_hook(void)

{
  pointer *pppSVar1;
  iterator __position;
  vector<SMTMap_*,_std::allocator<SMTMap_*>_> *pvVar2;
  int iVar3;
  SMTMap *this;
  char *pcVar4;
  long in_FS_OFFSET;
  SMTMap *globalmap;
  SMTMap *local_18;
  
  if (malloc_hook()::simplemalloctrace_init_begined == '\x01') {
    puts("malloc hook init begined, let\'s wait for semaphore");
    sem_wait((sem_t *)&smtinit_sem);
    puts("wait semaphore done!");
    return;
  }
  puts("malloc hook begin");
  malloc_hook()::simplemalloctrace_init_begined = 1;
  *(undefined4 *)(in_FS_OFFSET + -4) = 1;
  libc_malloc = (MALLOC_FUNCTION)dlsym(0xffffffffffffffff,"malloc");
  if (libc_malloc == (MALLOC_FUNCTION)0x0) {
    pcVar4 = "malloc";
  }
  else {
    libc_realloc = (REALLOC_FUNCTION)dlsym(0xffffffffffffffff,"realloc");
    if (libc_realloc == (REALLOC_FUNCTION)0x0) {
      pcVar4 = "realloc";
    }
    else {
      libc_calloc = (CALLOC_FUNCTION)dlsym(0xffffffffffffffff,"calloc");
      if (libc_calloc == (CALLOC_FUNCTION)0x0) {
        pcVar4 = "calloc";
      }
      else {
        libc_posix_memalign = (POSIX_MEMALIGN_FUNCTION)dlsym(0xffffffffffffffff,"posix_memalign");
        if (libc_posix_memalign == (POSIX_MEMALIGN_FUNCTION)0x0) {
          pcVar4 = "posix_memalign";
        }
        else {
          libc_aligned_alloc = (ALIGNED_ALLOC_FUNCTION)dlsym(0xffffffffffffffff,"aligned_alloc");
          if (libc_aligned_alloc == (ALIGNED_ALLOC_FUNCTION)0x0) {
            pcVar4 = "aligned_alloc";
          }
          else {
            libc_memalign = (MEMALIGN_FUNCTION)dlsym(0xffffffffffffffff,"memalign");
            if (libc_memalign == (MEMALIGN_FUNCTION)0x0) {
              pcVar4 = "memalign";
            }
            else {
              libc_free = (FREE_FUNCTION)dlsym(0xffffffffffffffff,"free");
              if (libc_free == (FREE_FUNCTION)0x0) {
                pcVar4 = "free";
              }
              else {
                libc_cfree = (CFREE_FUNCTION)dlsym(0xffffffffffffffff);
                if (libc_cfree != (CFREE_FUNCTION)0x0) {
                  iVar3 = sem_init((sem_t *)&smtinit_sem,0,0);
                  if (iVar3 == 0) {
                    *(undefined4 *)(in_FS_OFFSET + -4) = 0;
                    puts("malloc hook done, let\'s post the semaphore");
                    sem_post((sem_t *)&smtinit_sem);
                    *(undefined4 *)(in_FS_OFFSET + -8) = 1;
                    smtmaplist = (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)operator_new(0x18);
                    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    this = (SMTMap *)operator_new(0x440);
                    SMTMap::SMTMap(this,"before main()","main()",0);
                    builtin_strncpy(this->stopfile,"after main()",0xd);
                    builtin_strncpy(this->stopfunction,"main()",7);
                    this->stopline = 0;
                    pvVar2 = smtmaplist;
                    __position._M_current =
                         (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        (smtmaplist->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_18 = this;
                      std::vector<SMTMap*,std::allocator<SMTMap*>>::_M_realloc_insert<SMTMap*const&>
                                ((vector<SMTMap*,std::allocator<SMTMap*>> *)smtmaplist,__position,
                                 &local_18);
                    }
                    else {
                      *__position._M_current = this;
                      pppSVar1 = &(pvVar2->super__Vector_base<SMTMap_*,_std::allocator<SMTMap_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish;
                      *pppSVar1 = *pppSVar1 + 1;
                    }
                    *(undefined4 *)(in_FS_OFFSET + -8) = 0;
                    return;
                  }
                  puts("*** semaphore init failed");
                  goto LAB_00104bbe;
                }
                pcVar4 = "cfree";
              }
            }
          }
        }
      }
    }
  }
  printf("*** wrapper does not find [%s] in libc.so\n",pcVar4);
LAB_00104bbe:
  *(undefined4 *)(in_FS_OFFSET + -4) = 0;
  exit(1);
}

Assistant:

static void malloc_hook()
{
    static int simplemalloctrace_init_begined = 0;
    int r = 0;

    if (simplemalloctrace_init_begined) {
        SMTLOG("malloc hook init begined, let's wait for semaphore\n");
        sem_wait(&smtinit_sem);
        SMTLOG("wait semaphore done!\n");
        return;
    }
    
    SMTLOG("malloc hook begin\n");

    simplemalloctrace_init_begined = 1;

    calloc_for_dlsym = 1;
    do {
        libc_malloc = (MALLOC_FUNCTION)dlsym(RTLD_NEXT, malloc_symbol);
        if (!libc_malloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", malloc_symbol);
            r = 1;
            break;
        }
        libc_realloc = (REALLOC_FUNCTION)dlsym(RTLD_NEXT, realloc_symbol);
        if (!libc_realloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", realloc_symbol);
            r = 1;
            break;
        }
        libc_calloc = (CALLOC_FUNCTION)dlsym(RTLD_NEXT, calloc_symbol);
        if (!libc_calloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", calloc_symbol);
            r = 1;
            break;
        }
        libc_posix_memalign = (POSIX_MEMALIGN_FUNCTION)dlsym(RTLD_NEXT, posix_memalign_symbol);
        if (!libc_posix_memalign) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", posix_memalign_symbol);
            r = 1;
            break;
        }
        libc_aligned_alloc = (ALIGNED_ALLOC_FUNCTION)dlsym(RTLD_NEXT, aligned_alloc_symbol);
        if (!libc_aligned_alloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", aligned_alloc_symbol);
            r = 1;
            break;
        }
        libc_memalign = (MEMALIGN_FUNCTION)dlsym(RTLD_NEXT, memalign_symbol);
        if (!libc_memalign) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", memalign_symbol);
            r = 1;
            break;
        }
        libc_free = (FREE_FUNCTION)dlsym(RTLD_NEXT, free_symbol);
        if (!libc_free) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", free_symbol);
            r = 1;
            break;
        }
        libc_cfree = (CFREE_FUNCTION)dlsym(RTLD_NEXT, cfree_symbol);
        if (!libc_cfree) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", cfree_symbol);
            r = 1;
            break;
        }

        if (sem_init(&smtinit_sem, 0, 0)) {
            SMTLOG("*** semaphore init failed\n");
            r = 1;
            break;
        }

        r = 0;
    } while(0);
    calloc_for_dlsym = 0;

    if (r)
        exit(1);

    SMTLOG("malloc hook done, let's post the semaphore\n");
    sem_post(&smtinit_sem);
    
    use_origin_malloc = 1;
    smtmaplist = new std::vector<SMTMap*>();
    if (!smtmaplist) {
        SMTLOG("new AddressMap failed\n");
        exit(1);
    }
    SMTMap* globalmap = new SMTMap("before main()", "main()", 0);
    if (globalmap) {
        globalmap->stopAt("after main()", "main()", 0);
        smtmaplist->push_back(globalmap);
    }
    use_origin_malloc = 0;
}